

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

Gla_Man_t * Gla_ManStart(Gia_Man_t *pGia0,Abs_Par_t *pPars)

{
  Gia_Obj_t *pGVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  Abs_Par_t *pAVar9;
  uint uVar10;
  Gla_Man_t *pGVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar14;
  Gia_Man_t *pGVar15;
  int *__s;
  Gla_Obj_t *pGVar16;
  uint *puVar17;
  sat_solver2 *psVar18;
  Vec_Set_t *pVVar19;
  word **ppwVar20;
  word *pwVar21;
  Rnm_Man_t *pRVar22;
  int iVar23;
  uint uVar24;
  Gla_Obj_t *pGVar25;
  uint uVar26;
  size_t sVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  Gia_Obj_t *pGVar34;
  uint uVar35;
  uint uVar36;
  
  pGVar11 = (Gla_Man_t *)calloc(1,0xd0);
  pGVar11->pGia0 = pGia0;
  pGVar11->pPars = pPars;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar13 = (int *)malloc(400);
  pVVar12->pArray = piVar13;
  pGVar11->vAbs = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar13 = (int *)malloc(400);
  pVVar12->pArray = piVar13;
  pGVar11->vTemp = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar13 = (int *)malloc(400);
  pVVar12->pArray = piVar13;
  pGVar11->vAddedNew = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar13 = (int *)malloc(400);
  pVVar12->pArray = piVar13;
  pGVar11->vObjCounts = pVVar12;
  pAig = Gia_ManToAigSimple(pGia0);
  pCVar14 = Cnf_DeriveOther(pAig,1);
  pGVar11->pCnf = pCVar14;
  Aig_ManStop(pAig);
  pGVar15 = Gia_ManDupMapped(pGia0,pCVar14->vMapping);
  pGVar11->pGia = pGVar15;
  if (pPars->fPropFanout != 0) {
    Gia_ManStaticFanoutStart(pGVar15);
  }
  if (pGia0->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("pGia0->vGateClasses != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x355,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  pGVar15 = pGVar11->pGia;
  iVar3 = pGVar15->nObjs;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  iVar23 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar23 = iVar3;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar23;
  if (iVar23 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar23 << 2);
  }
  pVVar12->pArray = piVar13;
  pVVar12->nSize = iVar3;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,(long)iVar3 << 2);
  }
  pGVar15->vGateClasses = pVVar12;
  iVar3 = pGVar15->nObjs;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  iVar23 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar23 = iVar3;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar23;
  if (iVar23 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar23 << 2);
  }
  pVVar12->pArray = piVar13;
  pVVar12->nSize = iVar3;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,(long)iVar3 << 2);
  }
  pGVar11->vCoreCounts = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 0;
  pVVar12->nSize = 0;
  pVVar12->pArray = (int *)0x0;
  pGVar11->vProofIds = pVVar12;
  iVar3 = pGVar15->nObjs;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  iVar23 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar23 = iVar3;
  }
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar23;
  if (iVar23 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar23 << 2);
  }
  pVVar12->pArray = piVar13;
  pVVar12->nSize = iVar3;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,(long)iVar3 << 2);
  }
  sVar27 = (long)pGVar15->nObjs << 2;
  piVar13 = (int *)malloc(sVar27);
  memset(piVar13,0xff,sVar27);
  sVar27 = (long)pGVar15->nObjs << 2;
  __s = (int *)malloc(sVar27);
  memset(__s,0xff,sVar27);
  if (0 < pGia0->nObjs) {
    lVar28 = 0;
    do {
      pGVar34 = pGia0->pObjs;
      if (pGVar34 == (Gia_Obj_t *)0x0) break;
      uVar24 = pGVar34[lVar28].Value;
      if (uVar24 != 0xffffffff) {
        if ((int)uVar24 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar24 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x364,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
        }
        puVar17 = &pGVar34[lVar28].Value;
        uVar24 = uVar24 >> 1;
        *puVar17 = uVar24;
        if (pGVar15->nObjs <= (int)uVar24) {
          __assert_fail("(int)pObj->Value < Gia_ManObjNum(p->pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x366,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
        }
        piVar13[uVar24] = pCVar14->pObj2Count[lVar28];
        __s[*puVar17] = pCVar14->pObj2Clause[lVar28];
        if (pGia0->vGateClasses->nSize <= lVar28) goto LAB_00600215;
        if (pGia0->vGateClasses->pArray[lVar28] != 0) {
          uVar24 = *puVar17;
          if (((long)(int)uVar24 < 0) || (pGVar15->vGateClasses->nSize <= (int)uVar24))
          goto LAB_00600272;
          pGVar15->vGateClasses->pArray[(int)uVar24] = 1;
        }
        pVVar5 = pCVar14->vMapping;
        if (pVVar5->nSize <= lVar28) goto LAB_00600215;
        uVar24 = *puVar17;
        if (((long)(int)uVar24 < 0) || (pVVar12->nSize <= (int)uVar24)) {
LAB_00600272:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar6 = pVVar5->pArray;
        uVar31 = piVar6[lVar28];
        pVVar12->pArray[(int)uVar24] = pVVar12->nSize;
        if (((int)uVar31 < 0) || (pVVar5->nSize <= (int)uVar31)) goto LAB_00600291;
        piVar6 = piVar6 + uVar31;
        Vec_IntPush(pVVar12,*piVar6);
        lVar29 = 0;
        do {
          uVar24 = piVar6[lVar29 + 1];
          if ((ulong)uVar24 == 0xffffffff) {
            uVar24 = 0xffffffff;
          }
          else {
            if (((int)uVar24 < 0) || (pGia0->nObjs <= (int)uVar24)) goto LAB_006001d7;
            uVar24 = pGia0->pObjs[uVar24].Value;
            if (uVar24 == 0xffffffff) {
              __assert_fail("~Gia_ManObj(pGia0, pMapping[k])->Value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                            ,0x377,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
            }
          }
          Vec_IntPush(pVVar12,uVar24);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 4);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < pGia0->nObjs);
  }
  pVVar5 = pCVar14->vMapping;
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  if (pVVar5 != (Vec_Int_t *)0x0) {
    free(pVVar5);
  }
  pCVar14->vMapping = pVVar12;
  if (pCVar14->pObj2Count != (int *)0x0) {
    free(pCVar14->pObj2Count);
    pCVar14->pObj2Count = (int *)0x0;
  }
  pCVar14->pObj2Count = piVar13;
  if (pCVar14->pObj2Clause != (int *)0x0) {
    free(pCVar14->pObj2Clause);
    pCVar14->pObj2Clause = (int *)0x0;
  }
  pCVar14->pObj2Clause = __s;
  pGVar11->nObjs = 1;
  uVar24 = pGVar15->nObjs;
  if ((0 < (int)uVar24) && (pGVar15->pObjs != (Gia_Obj_t *)0x0)) {
    piVar13 = pCVar14->pObj2Count;
    puVar17 = &pGVar15->pObjs->Value;
    uVar30 = 0;
    do {
      if (piVar13[uVar30] < 0) {
        uVar31 = 0xffffffff;
      }
      else {
        uVar31 = pGVar11->nObjs;
        pGVar11->nObjs = uVar31 + 1;
      }
      *puVar17 = uVar31;
      uVar30 = uVar30 + 1;
      puVar17 = puVar17 + 3;
    } while (uVar24 != uVar30);
  }
  if (0 < pCVar14->nLiterals) {
    piVar13 = *pCVar14->pClauses;
    lVar28 = 0;
    do {
      uVar24 = piVar13[lVar28];
      uVar31 = (int)uVar24 >> 1;
      if (((int)uVar31 < 0) || (pGia0->nObjs <= (int)uVar31)) goto LAB_006001d7;
      uVar31 = pGia0->pObjs[uVar31].Value;
      if ((ulong)uVar31 == 0xffffffff) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x390,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      if (((int)uVar31 < 0) || (pGVar15->nObjs <= (int)uVar31)) goto LAB_006001d7;
      uVar31 = pGVar15->pObjs[uVar31].Value;
      if (uVar31 == 0xffffffff) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x393,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      piVar13[lVar28] = (uVar24 & 1) + uVar31 * 2;
      lVar28 = lVar28 + 1;
    } while (lVar28 < pCVar14->nLiterals);
  }
  iVar3 = pGVar11->nObjs;
  pGVar16 = (Gla_Obj_t *)calloc((long)iVar3,0x28);
  pGVar11->pObjs = pGVar16;
  sVar27 = (long)pGVar15->nObjs << 2;
  puVar17 = (uint *)malloc(sVar27);
  memset(puVar17,0xff,sVar27);
  pGVar11->pObj2Obj = puVar17;
  pGVar15 = pGVar11->pGia;
  iVar23 = pGVar15->nObjs;
  if ((0 < iVar23) && (pGVar34 = pGVar15->pObjs, pGVar34 != (Gia_Obj_t *)0x0)) {
    lVar28 = 0;
    do {
      puVar17[lVar28] = pGVar34->Value;
      uVar24 = pGVar34->Value;
      uVar30 = (ulong)uVar24;
      if (uVar30 != 0xffffffff) {
        if (((int)uVar24 < 0) || (iVar3 <= (int)uVar24)) goto LAB_0060032c;
        pGVar16[uVar30].iGiaObj = (int)lVar28;
        uVar24 = *(uint *)&pGVar16[uVar30].field_0x4;
        uVar31 = *(uint *)pGVar34 >> 0x1c & 2;
        *(uint *)&pGVar16[uVar30].field_0x4 = uVar24 & 0xfffffffd | uVar31;
        uVar31 = (uVar24 & 0xfffffff9 | uVar31) +
                 (uint)((~*(ulong *)pGVar34 & 0x1fffffff1fffffff) == 0) * 4;
        *(uint *)&pGVar16[uVar30].field_0x4 = uVar31;
        uVar35 = 0;
        uVar24 = 0;
        if (((uint)*(undefined8 *)pGVar34 & 0x9fffffff) == 0x9fffffff) {
          uVar24 = (uint)((int)((uint)((ulong)*(undefined8 *)pGVar34 >> 0x20) & 0x1fffffff) <
                         pGVar15->vCis->nSize - pGVar15->nRegs) << 3;
        }
        *(uint *)&pGVar16[uVar30].field_0x4 = uVar31 & 0xfffffff7 | uVar24;
        uVar26 = (uint)*(undefined8 *)pGVar34;
        if ((~uVar26 & 0x1fffffff) != 0 && (int)uVar26 < 0) {
          uVar35 = (uint)((int)((uint)((ulong)*(undefined8 *)pGVar34 >> 0x20) & 0x1fffffff) <
                         pGVar15->vCos->nSize - pGVar15->nRegs) << 4;
        }
        *(uint *)&pGVar16[uVar30].field_0x4 = uVar31 & 0xffffffe7 | uVar24 | uVar35;
        uVar10 = (uint)*(undefined8 *)pGVar34;
        uVar32 = 0;
        uVar26 = 0;
        if ((~uVar10 & 0x1fffffff) != 0 && (int)uVar10 < 0) {
          uVar26 = (uint)(pGVar15->vCos->nSize - pGVar15->nRegs <=
                         (int)((uint)((ulong)*(undefined8 *)pGVar34 >> 0x20) & 0x1fffffff)) << 6;
        }
        *(uint *)&pGVar16[uVar30].field_0x4 = uVar31 & 0xffffffa7 | uVar24 | uVar35 | uVar26;
        if (((uint)*(undefined8 *)pGVar34 & 0x9fffffff) == 0x9fffffff) {
          uVar32 = (uint)(pGVar15->vCis->nSize - pGVar15->nRegs <=
                         (int)((uint)((ulong)*(undefined8 *)pGVar34 >> 0x20) & 0x1fffffff)) << 5;
        }
        *(uint *)&pGVar16[uVar30].field_0x4 =
             uVar31 & 0xffffff87 | uVar24 | uVar35 | uVar26 | uVar32;
        uVar10 = (uint)((~*(uint *)pGVar34 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar34) << 7;
        *(uint *)&pGVar16[uVar30].field_0x4 =
             uVar31 & 0xffffff07 | uVar24 | uVar35 | uVar26 | uVar32 | uVar10;
        uVar7 = *(ulong *)pGVar34;
        if ((~uVar7 & 0x1fffffff1fffffff) != 0) {
          uVar36 = (uint)uVar7;
          uVar33 = (uint)(uVar7 >> 0x20);
          if (((uVar36 & 0x9fffffff) != 0x9fffffff) ||
             (pGVar15->vCis->nSize - pGVar15->nRegs <= (int)(uVar33 & 0x1fffffff))) {
            if ((uVar7 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar36) {
              if ((int)uVar36 < 0 || (int)(uVar7 & 0x1fffffff) == 0x1fffffff) {
                if (((uVar36 & 0x9fffffff) != 0x9fffffff) ||
                   ((int)(uVar33 & 0x1fffffff) < pGVar15->vCis->nSize - pGVar15->nRegs)) {
                  __assert_fail("Gia_ObjIsRo(p->pGia, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                                ,0x3bf,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
                }
                *(uint *)&pGVar16[uVar30].field_0x4 =
                     uVar31 & 0x107 | uVar24 | uVar35 | uVar26 | uVar32 | uVar10 | 0x200;
                if (((uint)*(undefined8 *)pGVar34 & 0x9fffffff) != 0x9fffffff) {
LAB_0060034b:
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar33 = (uint)((ulong)*(undefined8 *)pGVar34 >> 0x20) & 0x1fffffff;
                pVVar12 = pGVar15->vCis;
                iVar23 = pVVar12->nSize;
                if ((int)uVar33 < iVar23 - pGVar15->nRegs) goto LAB_0060034b;
                pVVar5 = pGVar15->vCos;
                uVar33 = (pVVar5->nSize - iVar23) + uVar33;
                if (((int)uVar33 < 0) || (pVVar5->nSize <= (int)uVar33)) goto LAB_00600215;
                piVar13 = pVVar5->pArray;
                iVar23 = piVar13[uVar33];
                if (((long)iVar23 < 0) || (pGVar15->nObjs <= iVar23)) goto LAB_006001d7;
                pGVar8 = pGVar15->pObjs;
                pGVar1 = pGVar8 + iVar23;
                pGVar16[uVar30].Fanins[0] =
                     pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value;
                if (((uint)*(undefined8 *)pGVar34 & 0x9fffffff) != 0x9fffffff) goto LAB_0060034b;
                uVar33 = (uint)((ulong)*(undefined8 *)pGVar34 >> 0x20) & 0x1fffffff;
                iVar23 = pVVar12->nSize;
                if ((int)uVar33 < iVar23 - pGVar15->nRegs) goto LAB_0060034b;
                uVar33 = (pVVar5->nSize - iVar23) + uVar33;
                if (((int)uVar33 < 0) || (pVVar5->nSize <= (int)uVar33)) goto LAB_00600215;
                iVar23 = piVar13[uVar33];
                if (((long)iVar23 < 0) || (pGVar15->nObjs <= iVar23)) goto LAB_006001d7;
                *(uint *)&pGVar16[uVar30].field_0x4 =
                     uVar31 & 0x105 | uVar24 | uVar35 | uVar26 | uVar32 | uVar10 | 0x200 |
                     *(uint *)(pGVar8 + iVar23) >> 0x1c & 2;
              }
              else {
                pVVar12 = pGVar11->pCnf->vMapping;
                iVar23 = pVVar12->nSize;
                if (iVar23 <= lVar28) goto LAB_00600215;
                piVar13 = pVVar12->pArray;
                iVar4 = piVar13[lVar28];
                if (((long)iVar4 < 0) || (iVar23 <= iVar4)) {
LAB_00600291:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                }
                *(uint *)&pGVar16[uVar30].field_0x4 =
                     uVar31 & 0x107 | uVar24 | uVar35 | uVar26 | uVar32 | uVar10;
                lVar29 = 0;
                do {
                  uVar24 = piVar13[(long)iVar4 + lVar29 + 1];
                  if ((ulong)uVar24 != 0xffffffff) {
                    if (((int)uVar24 < 0) || (pGVar15->nObjs <= (int)uVar24)) goto LAB_006001d7;
                    uVar24 = pGVar15->pObjs[uVar24].Value;
                    uVar31 = *(uint *)&pGVar16[uVar30].field_0x4;
                    *(uint *)&pGVar16[uVar30].field_0x4 = uVar31 + 0x200;
                    pGVar16[uVar30].Fanins[uVar31 >> 9] = uVar24;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 4);
              }
            }
            else {
              *(uint *)&pGVar16[uVar30].field_0x4 =
                   uVar31 & 0x107 | uVar24 | uVar35 | uVar26 | uVar32 | uVar10 | 0x200;
              pGVar16[uVar30].Fanins[0] =
                   pGVar34[-(ulong)((uint)*(undefined8 *)pGVar34 & 0x1fffffff)].Value;
            }
          }
        }
      }
      lVar28 = lVar28 + 1;
      iVar23 = pGVar15->nObjs;
    } while ((lVar28 < iVar23) &&
            (pGVar34 = pGVar15->pObjs + lVar28, pGVar15->pObjs != (Gia_Obj_t *)0x0));
  }
  iVar4 = pGVar15->vCos->nSize;
  if (iVar4 <= pGVar15->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar4 < 1) {
LAB_00600215:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = *pGVar15->vCos->pArray;
  if (((long)iVar4 < 0) || (iVar23 <= iVar4)) {
LAB_006001d7:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar24 = pGVar15->pObjs[iVar4].Value;
  if (((long)(int)uVar24 < 0) || (iVar3 <= (int)uVar24)) {
LAB_0060032c:
    __assert_fail("i >= 0 && i < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
  }
  pGVar25 = (Gla_Obj_t *)0x0;
  if (uVar24 != 0) {
    pGVar25 = pGVar16 + (int)uVar24;
  }
  pGVar11->pObjRoot = pGVar25;
  if (pGVar15->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("p->pGia->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x3c6,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  if (1 < iVar3) {
    uVar30 = 0x28;
    do {
      iVar23 = *(int *)((long)pGVar16->Fanins + (uVar30 - 8));
      if (((long)iVar23 < 0) || (pGVar15->vGateClasses->nSize <= iVar23)) goto LAB_00600215;
      if (pGVar15->vGateClasses->pArray[iVar23] != 0) {
        pbVar2 = (byte *)((long)pGVar16->Fanins + (uVar30 - 4));
        *pbVar2 = *pbVar2 | 1;
        if ((Gla_Obj_t *)((long)pGVar16->Fanins + (uVar30 - 8)) <= pGVar16) {
          __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x6d,"int Gla_ObjId(Gla_Man_t *, Gla_Obj_t *)");
        }
        Vec_IntPush(pGVar11->vAbs,(int)(uVar30 >> 3) * -0x33333333);
      }
      lVar28 = uVar30 - 8;
      uVar30 = uVar30 + 0x28;
    } while ((Gla_Obj_t *)((long)pGVar16[1].Fanins + lVar28) < pGVar16 + iVar3);
  }
  psVar18 = sat_solver2_new();
  pGVar11->pSat = psVar18;
  if (pPars->fUseFullProof != 0) {
    pVVar19 = (Vec_Set_t *)calloc(1,0x20);
    pVVar19->nPageSize = 0;
    pVVar19->uPageMask = 0;
    pVVar19->nEntries = 0;
    pVVar19->iPage = 0;
    pVVar19->iPageS = 0;
    pVVar19->nPagesAlloc = 0;
    pVVar19->pPages = (word **)0x0;
    pVVar19->nPageSize = 0x14;
    pVVar19->uPageMask = 0xfffff;
    pVVar19->nPagesAlloc = 0x100;
    ppwVar20 = (word **)calloc(0x100,8);
    pVVar19->pPages = ppwVar20;
    pwVar21 = (word *)malloc(0x800000);
    *ppwVar20 = pwVar21;
    *(undefined4 *)pwVar21 = 0xffffffff;
    *(undefined4 *)((long)pwVar21 + 4) = 0xffffffff;
    *(undefined4 *)(pwVar21 + 1) = 0xffffffff;
    *(undefined4 *)((long)pwVar21 + 0xc) = 0xffffffff;
    *pwVar21 = 2;
    psVar18->pPrf1 = pVVar19;
  }
  pAVar9 = pGVar11->pPars;
  iVar3 = pAVar9->nLearnedStart;
  psVar18->nLearntStart = iVar3;
  psVar18->nLearntDelta = pAVar9->nLearnedDelta;
  psVar18->nLearntRatio = pAVar9->nLearnedPerce;
  psVar18->nLearntMax = iVar3;
  pGVar11->nSatVars = 1;
  pRVar22 = Rnm_ManStart(pGVar15);
  pGVar11->pRnm = pRVar22;
  return pGVar11;
}

Assistant:

Gla_Man_t * Gla_ManStart( Gia_Man_t * pGia0, Abs_Par_t * pPars )
{
    Gla_Man_t * p;
    Aig_Man_t * pAig;
    Gia_Obj_t * pObj;
    Gla_Obj_t * pGla;
    Vec_Int_t * vMappingNew;
    int i, k, Offset, * pMapping, * pLits, * pObj2Count, * pObj2Clause;

    // start
    p = ABC_CALLOC( Gla_Man_t, 1 );
    p->pGia0 = pGia0;
    p->pPars = pPars;
    p->vAbs  = Vec_IntAlloc( 100 );
    p->vTemp = Vec_IntAlloc( 100 );
    p->vAddedNew = Vec_IntAlloc( 100 );
    p->vObjCounts = Vec_IntAlloc( 100 );

    // internal data
    pAig = Gia_ManToAigSimple( pGia0 );
    p->pCnf = Cnf_DeriveOther( pAig, 1 );
    Aig_ManStop( pAig );
    // create working GIA
    p->pGia = Gia_ManDupMapped( pGia0, p->pCnf->vMapping );
    if ( pPars->fPropFanout )
        Gia_ManStaticFanoutStart( p->pGia );

    // derive new gate map
    assert( pGia0->vGateClasses != 0 );
    p->pGia->vGateClasses = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vCoreCounts = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vProofIds = Vec_IntAlloc(0);
    // update p->pCnf->vMapping, p->pCnf->pObj2Count, p->pCnf->pObj2Clause 
    // (here are not updating p->pCnf->pVarNums because it is not needed)
    vMappingNew = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( pGia0, pObj, i )
    {
        // skip internal nodes not used in the mapping
        if ( !~pObj->Value )
            continue;
        // replace positive literal by variable
        assert( !Abc_LitIsCompl(pObj->Value) );
        pObj->Value = Abc_Lit2Var(pObj->Value);
        assert( (int)pObj->Value < Gia_ManObjNum(p->pGia) );
        // update arrays
        pObj2Count[pObj->Value] = p->pCnf->pObj2Count[i];
        pObj2Clause[pObj->Value] = p->pCnf->pObj2Clause[i];
        if ( Vec_IntEntry(pGia0->vGateClasses, i) )
            Vec_IntWriteEntry( p->pGia->vGateClasses, pObj->Value, 1 );
        // update mappings
        Offset = Vec_IntEntry(p->pCnf->vMapping, i);
        Vec_IntWriteEntry( vMappingNew, pObj->Value, Vec_IntSize(vMappingNew) );
        pMapping = Vec_IntEntryP(p->pCnf->vMapping, Offset);
        Vec_IntPush( vMappingNew, pMapping[0] );
        for ( k = 1; k <= 4; k++ )
        {
            if ( pMapping[k] == -1 )
                Vec_IntPush( vMappingNew, -1 );
            else
            {
                assert( ~Gia_ManObj(pGia0, pMapping[k])->Value );
                Vec_IntPush( vMappingNew, Gia_ManObj(pGia0, pMapping[k])->Value );
            }
        }
    }
    // update mapping after the offset (currently not being done because it is not used)
    Vec_IntFree( p->pCnf->vMapping );  p->pCnf->vMapping    = vMappingNew;
    ABC_FREE( p->pCnf->pObj2Count );   p->pCnf->pObj2Count  = pObj2Count;
    ABC_FREE( p->pCnf->pObj2Clause );  p->pCnf->pObj2Clause = pObj2Clause;


    // count the number of variables
    p->nObjs = 1;
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( p->pCnf->pObj2Count[i] >= 0 )
            pObj->Value = p->nObjs++;
        else
            pObj->Value = ~0;

    // re-express CNF using new variable IDs
    pLits = p->pCnf->pClauses[0];
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
    {
        // find the original AIG object
        pObj = Gia_ManObj( pGia0, lit_var(pLits[i]) );
        assert( ~pObj->Value );
        // find the working AIG object
        pObj = Gia_ManObj( p->pGia, pObj->Value );
        assert( ~pObj->Value );
        // express literal in terms of LUT variables
        pLits[i] = toLitCond( pObj->Value, lit_sign(pLits[i]) );
    }

    // create objects 
    p->pObjs    = ABC_CALLOC( Gla_Obj_t, p->nObjs );
    p->pObj2Obj = ABC_FALLOC( unsigned, Gia_ManObjNum(p->pGia) );
//    p->pvRefis  = ABC_CALLOC( Vec_Int_t, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        p->pObj2Obj[i] = pObj->Value;
        if ( !~pObj->Value )
            continue;
        pGla = Gla_ManObj( p, pObj->Value );
        pGla->iGiaObj = i;
        pGla->fCompl0 = Gia_ObjFaninC0(pObj);
        pGla->fConst  = Gia_ObjIsConst0(pObj);
        pGla->fPi     = Gia_ObjIsPi(p->pGia, pObj);
        pGla->fPo     = Gia_ObjIsPo(p->pGia, pObj);
        pGla->fRi     = Gia_ObjIsRi(p->pGia, pObj);
        pGla->fRo     = Gia_ObjIsRo(p->pGia, pObj);
        pGla->fAnd    = Gia_ObjIsAnd(pObj);
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            pGla->nFanins = 1;
            pGla->Fanins[0] = Gia_ObjFanin0(pObj)->Value;
            continue;
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
//            Gla_ManCollectFanins( p, pGla, pObj->Value, p->vTemp );
//            pGla->nFanins = Vec_IntSize( p->vTemp );
//            memcpy( pGla->Fanins, Vec_IntArray(p->vTemp), sizeof(int) * Vec_IntSize(p->vTemp) );
            Offset = Vec_IntEntry( p->pCnf->vMapping, i );
            pMapping = Vec_IntEntryP( p->pCnf->vMapping, Offset );
            pGla->nFanins = 0;
            for ( k = 1; k <= 4; k++ )
                if ( pMapping[k] != -1 )
                    pGla->Fanins[ pGla->nFanins++ ] = Gia_ManObj(p->pGia, pMapping[k])->Value;
            continue;
        }
        assert( Gia_ObjIsRo(p->pGia, pObj) );
        pGla->nFanins   = 1;
        pGla->Fanins[0] = Gia_ObjFanin0( Gia_ObjRoToRi(p->pGia, pObj) )->Value;
        pGla->fCompl0   = Gia_ObjFaninC0( Gia_ObjRoToRi(p->pGia, pObj) );
    }
    p->pObjRoot = Gla_ManObj( p, Gia_ManPo(p->pGia, 0)->Value );
    // abstraction 
    assert( p->pGia->vGateClasses != NULL );
    Gla_ManForEachObj( p, pGla )
    {
        if ( Vec_IntEntry( p->pGia->vGateClasses, pGla->iGiaObj ) == 0 )
            continue;
        pGla->fAbs = 1;
        Vec_IntPush( p->vAbs, Gla_ObjId(p, pGla) );
    }
    // other 
    p->pSat        = sat_solver2_new();
    if ( pPars->fUseFullProof )
        p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    p->nSatVars  = 1;
    // start the refinement manager
//    p->pGia2 = Gia_ManDup( p->pGia );
    p->pRnm = Rnm_ManStart( p->pGia );
    return p;
}